

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

int isAftSpell(int aftype)

{
  int aftype_local;
  
  aftype_local = aftype;
  if ((((aftype != 1) && (aftype != 2)) && (aftype != 3)) &&
     (((aftype != 5 && (aftype != 6)) && ((aftype != 4 && (aftype != 7)))))) {
    aftype_local = 0;
  }
  return aftype_local;
}

Assistant:

int isAftSpell(int aftype)
{
	if (aftype != AFT_SKILL
		&& aftype != AFT_POWER
		&& aftype != AFT_MALADY
		&& aftype != AFT_INVIS
		&& aftype != AFT_RUNE
		&& aftype != AFT_COMMUNE
		&& aftype != AFT_TIMER)
	{
		aftype = AFT_SPELL;
	}

	return aftype;
}